

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_type_lookupSelectorRecursively
          (sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_tuple_t selector)

{
  _Bool _Var1;
  sysbvm_tuple_t in_RAX;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t extraout_RDX;
  sysbvm_chunkedAllocatorChunk_t *dictionary;
  sysbvm_context_t *context_00;
  sysbvm_tuple_t found;
  sysbvm_tuple_t local_18;
  
  if ((((ulong)context & 0xf) == 0 && context != (sysbvm_context_t *)0x0) &&
     (((ulong)(context->heap).lastMallocObject & 0x80) == 0)) {
    if (((ulong)(context->heap).lastMallocObject & 0x80) == 0) {
      dictionary = (context->heap).codeAllocator.firstChunk;
    }
    else {
      dictionary = (sysbvm_chunkedAllocatorChunk_t *)0x0;
    }
    local_18 = in_RAX;
    if (dictionary != (sysbvm_chunkedAllocatorChunk_t *)0x0) {
      local_18 = 0;
      _Var1 = sysbvm_methodDictionary_find((sysbvm_tuple_t)dictionary,type,&local_18);
      selector = extraout_RDX;
      if (_Var1) {
        return local_18;
      }
    }
    if (((ulong)(context->heap).lastMallocObject & 0x80) == 0) {
      context_00 = *(sysbvm_context_t **)&(context->heap).gcWhiteColor;
    }
    else {
      context_00 = (sysbvm_context_t *)0x0;
    }
    sVar2 = sysbvm_type_lookupSelectorRecursively(context_00,type,selector);
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_type_lookupSelectorRecursively(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_tuple_t selector)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return SYSBVM_NULL_TUPLE;
    if(sysbvm_tuple_isDummyValue(type)) return SYSBVM_NULL_TUPLE;
    sysbvm_tuple_t methodDictionary = sysbvm_type_getMethodDictionary(type);
    if(methodDictionary)
    {
        sysbvm_tuple_t found = SYSBVM_NULL_TUPLE;
        if(sysbvm_methodDictionary_find(methodDictionary, selector, &found))
            return found;
    }

    return sysbvm_type_lookupSelectorRecursively(context, sysbvm_type_getSupertype(type), selector);
}